

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  Context *pCVar5;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar8;
  GeneratorFactory *pGVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar10;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *pAVar11;
  FileDescriptor *file;
  long lVar12;
  allocator local_1e9;
  long *local_1e8;
  Descriptor *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  string *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c8;
  string *local_1c0;
  scoped_ptr<google::protobuf::compiler::java::Context> *local_1b8;
  long local_1b0;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string filename;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector_2;
  GeneratedCodeInfo annotations;
  string info_full_path;
  EnumLiteGenerator generator;
  Printer local_b8;
  ZeroCopyOutputStream *pZVar6;
  undefined4 extraout_var_00;
  
  file = this->file_;
  if (*(char *)(*(long *)(file + 0xa0) + 0xa0) == '\x01') {
    local_1b8 = &this->context_;
    local_1d0 = &this->java_package_;
    lVar12 = 0;
    lVar10 = 0;
    local_1e0 = (Descriptor *)context;
    local_1d8 = annotation_list;
    local_1c8 = file_list;
    local_1c0 = package_dir;
    while( true ) {
      if (*(int *)(file + 0x68) <= lVar10) break;
      local_1b0 = lVar10;
      pCVar5 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                         (local_1b8);
      if (((pCVar5->options_).enforce_lite == false) &&
         (*(int *)(*(long *)(file + 0xa0) + 0xa8) != 3)) {
        EnumGenerator::EnumGenerator
                  ((EnumGenerator *)&generator,
                   (EnumDescriptor *)(*(long *)(this->file_ + 0x70) + lVar12),this->immutable_api_,
                   (this->context_).ptr_);
        lVar10 = *(long *)(this->file_ + 0x70);
        local_1e8 = (long *)CONCAT71(local_1e8._1_7_,(this->options_).annotate_code);
        std::__cxx11::string::string((string *)&annotation_collector_2,"",&local_1e9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations,local_1c0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar10 + lVar12));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotation_collector_2);
        std::operator+(&filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,".java");
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&annotations);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_1c8,&filename);
        std::operator+(&info_full_path,&filename,".pb.meta");
        GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
        annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
             (_func_int **)&PTR_AddAnnotation_00424d88;
        annotation_collector.annotation_proto_ = &annotations;
        iVar4 = (*(*(_func_int ***)local_1e0)[2])(local_1e0,&filename);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar4);
        pAVar11 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
        if ((char)local_1e8 != '\0') {
          pAVar11 = &annotation_collector;
        }
        io::Printer::Printer(&local_b8,pZVar6,'$',&pAVar11->super_AnnotationCollector);
        io::Printer::Print(&local_b8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar10 + 0x10 + lVar12));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print(&local_b8,"package $package$;\n\n","package",local_1d0);
        }
        EnumGenerator::Generate((EnumGenerator *)&generator,&local_b8);
        if ((char)local_1e8 != '\0') {
          iVar4 = (*(*(_func_int ***)local_1e0)[2])(local_1e0,&info_full_path);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar4);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_1d8,&info_full_path);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        io::Printer::~Printer(&local_b8);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
        std::__cxx11::string::~string((string *)&info_full_path);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&annotation_collector_2);
        EnumGenerator::~EnumGenerator((EnumGenerator *)&generator);
      }
      else {
        EnumLiteGenerator::EnumLiteGenerator
                  (&generator,(EnumDescriptor *)(*(long *)(this->file_ + 0x70) + lVar12),
                   this->immutable_api_,(this->context_).ptr_);
        lVar10 = *(long *)(this->file_ + 0x70);
        local_1e8 = (long *)CONCAT71(local_1e8._1_7_,(this->options_).annotate_code);
        std::__cxx11::string::string((string *)&annotation_collector_2,"",&local_1e9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations,local_1c0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar10 + lVar12));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotation_collector_2);
        std::operator+(&filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,".java");
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&annotations);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_1c8,&filename);
        std::operator+(&info_full_path,&filename,".pb.meta");
        GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
        annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
             (_func_int **)&PTR_AddAnnotation_00424d88;
        annotation_collector.annotation_proto_ = &annotations;
        iVar4 = (*(*(_func_int ***)local_1e0)[2])(local_1e0,&filename);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
        pAVar11 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
        if ((char)local_1e8 != '\0') {
          pAVar11 = &annotation_collector;
        }
        io::Printer::Printer(&local_b8,pZVar6,'$',&pAVar11->super_AnnotationCollector);
        io::Printer::Print(&local_b8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar10 + 0x10 + lVar12));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print(&local_b8,"package $package$;\n\n","package",local_1d0);
        }
        EnumLiteGenerator::Generate(&generator,&local_b8);
        if ((char)local_1e8 != '\0') {
          iVar4 = (*(*(_func_int ***)local_1e0)[2])(local_1e0,&info_full_path);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_1d8,&info_full_path);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        io::Printer::~Printer(&local_b8);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
        std::__cxx11::string::~string((string *)&info_full_path);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&annotation_collector_2);
        EnumLiteGenerator::~EnumLiteGenerator(&generator);
      }
      lVar10 = local_1b0 + 1;
      file = this->file_;
      lVar12 = lVar12 + 0x38;
    }
    lVar12 = 0;
    for (lVar10 = 0; lVar10 < *(int *)(file + 0x58); lVar10 = lVar10 + 1) {
      if (this->immutable_api_ == true) {
        lVar1 = *(long *)(file + 0x60);
        bVar3 = (this->options_).annotate_code;
        std::__cxx11::string::string((string *)&local_b8,"OrBuilder",(allocator *)&annotations);
        psVar8 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar10);
        generator.descriptor_ = (EnumDescriptor *)0x29;
        generator.canonical_values_.
        super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)local_1c0,local_1d0,(string *)(lVar1 + lVar12),local_1e0,
                   (GeneratorContext *)local_1c8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)bVar3,SUB81(local_1d8,0),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_b8,(string *)psVar8->ptr_,(MessageGenerator *)0x29,0);
        std::__cxx11::string::~string((string *)&local_b8);
        file = this->file_;
      }
      lVar1 = *(long *)(file + 0x60);
      bVar3 = (this->options_).annotate_code;
      std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&annotations);
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar10);
      generator.descriptor_ = (EnumDescriptor *)0x21;
      generator.canonical_values_.
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                ((java *)local_1c0,local_1d0,(string *)(lVar1 + lVar12),local_1e0,
                 (GeneratorContext *)local_1c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ulong)bVar3,SUB81(local_1d8,0),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_b8,(string *)psVar8->ptr_,(MessageGenerator *)0x21,0);
      std::__cxx11::string::~string((string *)&local_b8);
      file = this->file_;
      lVar12 = lVar12 + 0xa8;
    }
    pCVar5 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->(local_1b8);
    bVar3 = HasGenericServices(file,(pCVar5->options_).enforce_lite);
    if (bVar3) {
      local_1b8 = (scoped_ptr<google::protobuf::compiler::java::Context> *)&this->generator_factory_
      ;
      lVar10 = 0;
      for (local_1b0 = 0; local_1b0 < *(int *)(this->file_ + 0x78); local_1b0 = local_1b0 + 1) {
        pGVar9 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::
                 operator->((scoped_ptr<google::protobuf::compiler::java::GeneratorFactory> *)
                            local_1b8);
        iVar4 = (*pGVar9->_vptr_GeneratorFactory[4])(pGVar9,*(long *)(this->file_ + 0x80) + lVar10);
        local_1e8 = (long *)CONCAT44(extraout_var_03,iVar4);
        lVar12 = *(long *)(this->file_ + 0x80);
        bVar3 = (this->options_).annotate_code;
        std::__cxx11::string::string
                  ((string *)&info_full_path,"",(allocator *)&annotation_collector);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &generator,local_1c0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar12 + lVar10));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &generator,&info_full_path);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,".java");
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&generator);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_1c8,(value_type *)&annotations);
        std::operator+(&filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &annotations,".pb.meta");
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&generator);
        annotation_collector_2.super_AnnotationCollector._vptr_AnnotationCollector =
             (_func_int **)&PTR_AddAnnotation_00424d88;
        annotation_collector_2.annotation_proto_ = (GeneratedCodeInfo *)&generator;
        iVar4 = (*(*(_func_int ***)local_1e0)[2])(local_1e0,&annotations);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_04,iVar4);
        pAVar11 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
        if (bVar3 != false) {
          pAVar11 = &annotation_collector_2;
        }
        io::Printer::Printer(&local_b8,pZVar6,'$',&pAVar11->super_AnnotationCollector);
        plVar2 = local_1e8;
        io::Printer::Print(&local_b8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar12 + 0x10 + lVar10));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print(&local_b8,"package $package$;\n\n","package",local_1d0);
        }
        (**(code **)(*plVar2 + 0x10))(plVar2,&local_b8);
        if (bVar3 != false) {
          iVar4 = (*(*(_func_int ***)local_1e0)[2])(local_1e0,&filename);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_05,iVar4);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&generator,pZVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_1d8,&filename);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
        }
        io::Printer::~Printer(&local_b8);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&generator);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&annotations);
        std::__cxx11::string::~string((string *)&info_full_path);
        (**(code **)(*plVar2 + 8))(plVar2);
        lVar10 = lVar10 + 0x30;
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     std::vector<string>* file_list,
                                     std::vector<string>* annotation_list) {
  if (MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator generator(file_->enum_type(i), immutable_api_,
                                context_.get());
        GenerateSibling<EnumGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumGenerator::Generate);
      } else {
        EnumLiteGenerator generator(file_->enum_type(i), immutable_api_,
                                    context_.get());
        GenerateSibling<EnumLiteGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumLiteGenerator::Generate);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      if (immutable_api_) {
        GenerateSibling<MessageGenerator>(
            package_dir, java_package_, file_->message_type(i), context,
            file_list, options_.annotate_code, annotation_list, "OrBuilder",
            message_generators_[i].get(), &MessageGenerator::GenerateInterface);
      }
      GenerateSibling<MessageGenerator>(
          package_dir, java_package_, file_->message_type(i), context,
          file_list, options_.annotate_code, annotation_list, "",
          message_generators_[i].get(), &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        GenerateSibling<ServiceGenerator>(
            package_dir, java_package_, file_->service(i), context, file_list,
            options_.annotate_code, annotation_list, "", generator.get(),
            &ServiceGenerator::Generate);
      }
    }
  }
}